

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pageview.cpp
# Opt level: O2

void __thiscall QtMWidgets::PageView::removeWidget(PageView *this,QWidget *widget)

{
  PageViewPrivate *pPVar1;
  int iVar2;
  int iVar3;
  
  iVar2 = indexOf(this,widget);
  if (iVar2 != -1) {
    QList<QWidget_*>::removeAt(&((this->d).d)->pages,(long)iVar2);
    QWidget::setParent(widget);
    QWidget::hide();
    iVar3 = currentIndex(this);
    pPVar1 = (this->d).d;
    PageControl::setCount(pPVar1->control,(int)(pPVar1->pages).d.size);
    if (iVar2 == iVar3) {
      iVar2 = currentIndex(this);
      if (iVar2 != -1) {
        pPVar1 = (this->d).d;
        iVar2 = currentIndex(this);
        PageViewPrivate::showPage(pPVar1,iVar2);
        return;
      }
    }
  }
  return;
}

Assistant:

void
PageView::removeWidget( QWidget * widget )
{
	const int index  = indexOf( widget );

	if( index != -1 )
	{
		d->pages.removeAt( index );

		widget->setParent( 0 );

		widget->hide();

		const bool changePage = index == currentIndex();

		d->control->setCount( d->pages.count() );

		if( changePage && currentIndex() != -1 )
			d->showPage( currentIndex() );
	}
}